

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.cpp
# Opt level: O1

void boost::deflate::easy_test::test_compress(void)

{
  long *plVar1;
  wrap in_R8B;
  wrap wVar2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  plVar1 = test_suite::detail::current()::p;
  easy_compress_abi_cxx11_(&local_38,(deflate *)0x11d923,(string_view)ZEXT816(0),in_R8B);
  wVar2 = 0x3d;
  (**(code **)(*plVar1 + 0x28 + (ulong)(local_38.super_type.m_initialized ^ 1) * 8))
            (plVar1,"easy_compress(\"\")",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/easy.cpp"
            );
  if (local_38.super_type.m_initialized == true) {
    if (local_38.super_type.m_storage.dummy_.aligner_ !=
        (type)((long)&local_38.super_type.m_storage.dummy_ + 0x10)) {
      operator_delete((void *)local_38.super_type.m_storage.dummy_.aligner_,
                      local_38.super_type.m_storage.dummy_._16_8_ + 1);
    }
    local_38.super_type.m_initialized = false;
  }
  plVar1 = test_suite::detail::current()::p;
  easy_compress_abi_cxx11_(&local_60,(deflate *)"aaaaaaaaaaaaaaa",(string_view)ZEXT816(0xf),wVar2);
  wVar2 = 0x3d;
  (**(code **)(*plVar1 + 0x28 + (ulong)(local_60.super_type.m_initialized ^ 1) * 8))
            (plVar1,"easy_compress(\"aaaaaaaaaaaaaaa\")",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/easy.cpp"
            );
  if (local_60.super_type.m_initialized == true) {
    if (local_60.super_type.m_storage.dummy_.aligner_ !=
        (type)((long)&local_60.super_type.m_storage.dummy_ + 0x10)) {
      operator_delete((void *)local_60.super_type.m_storage.dummy_.aligner_,
                      local_60.super_type.m_storage.dummy_._16_8_ + 1);
    }
    local_60.super_type.m_initialized = false;
  }
  plVar1 = test_suite::detail::current()::p;
  easy_compress_abi_cxx11_
            (&local_88,(deflate *)"This is a test string",(string_view)ZEXT816(0x15),wVar2);
  (**(code **)(*plVar1 + 0x28 + (ulong)(local_88.super_type.m_initialized ^ 1) * 8))
            (plVar1,"easy_compress(\"This is a test string\")",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/easy.cpp"
             ,0x17,"static void boost::deflate::easy_test::test_compress()");
  if ((local_88.super_type.m_initialized == true) &&
     (local_88.super_type.m_storage.dummy_.aligner_ !=
      (type)((long)&local_88.super_type.m_storage.dummy_ + 0x10))) {
    operator_delete((void *)local_88.super_type.m_storage.dummy_.aligner_,
                    local_88.super_type.m_storage.dummy_._16_8_ + 1);
  }
  return;
}

Assistant:

static void test_compress() {
      BOOST_TEST(easy_compress(""));
      BOOST_TEST(easy_compress("aaaaaaaaaaaaaaa"));
      BOOST_TEST(easy_compress("This is a test string"));
  }